

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::CloneFilterOperation::set(CloneFilterOperation *this,string_view property,double param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffff37;
  string_view in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_91 [3];
  __sv_type local_30;
  
  uVar1 = 1;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
  __lhs = local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
             (allocator<char> *)in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff60,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58,
             (allocator<char> *)in_stack_ffffffffffffff50);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(__lhs,(char *)this_00);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  InvalidParameter::InvalidParameter
            ((InvalidParameter *)
             CONCAT17(in_stack_ffffffffffffff37,CONCAT16(uVar1,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff38);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void CloneFilterOperation::set(std::string_view property, double /*val*/)
{
    throw(helics::InvalidParameter(std::string("property ") + std::string(property) +
                                   " is not a known property"));
}